

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VarCommand.cpp
# Opt level: O0

void __thiscall VarCommand::doCommand(VarCommand *this)

{
  unsigned_long uVar1;
  reference pvVar2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_50;
  undefined1 local_38 [40];
  unsigned_long index;
  VarCommand *this_local;
  
  index = (unsigned_long)this;
  uVar1 = DataCommands::getIndex(this->dataCommands);
  local_38._32_8_ = uVar1 + 1;
  DataCommands::getSeparated_abi_cxx11_(&local_50,this->dataCommands);
  pvVar2 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::at(&local_50,local_38._32_8_);
  std::__cxx11::string::string((string *)local_38,(string *)pvVar2);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_50);
  DataVars::addNewVar(this->dataVars,(string *)local_38);
  DataCommands::setIndex(this->dataCommands,local_38._32_8_);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void VarCommand::doCommand() {
    // get the index from dataCommands
    unsigned long index = this->dataCommands->getIndex();
    // skip the command
    index++;
    // get the name from the vector in dataCommands
    string name = this->dataCommands->getSeparated().at(index);
    // else, we add the new var to the map in dataVars
    this->dataVars->addNewVar(name);
    // set the new index of dataCommands
    this->dataCommands->setIndex(index);
}